

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Plane * __thiscall SceneParser::parsePlane(SceneParser *this)

{
  int iVar1;
  Plane *this_00;
  float d;
  undefined1 local_84 [4];
  float offset;
  Vector3f normal;
  char token [100];
  SceneParser *this_local;
  
  getToken(this,(char *)(normal.m_elements + 1));
  iVar1 = strcmp((char *)(normal.m_elements + 1),"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x166,"Plane *SceneParser::parsePlane()");
  }
  getToken(this,(char *)(normal.m_elements + 1));
  iVar1 = strcmp((char *)(normal.m_elements + 1),"normal");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"normal\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x168,"Plane *SceneParser::parsePlane()");
  }
  readVector3f((SceneParser *)local_84);
  getToken(this,(char *)(normal.m_elements + 1));
  iVar1 = strcmp((char *)(normal.m_elements + 1),"offset");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"offset\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x16b,"Plane *SceneParser::parsePlane()");
  }
  d = readFloat(this);
  getToken(this,(char *)(normal.m_elements + 1));
  iVar1 = strcmp((char *)(normal.m_elements + 1),"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x16e,"Plane *SceneParser::parsePlane()");
  }
  if (this->_current_material != (Material *)0x0) {
    this_00 = (Plane *)operator_new(0x40);
    Plane::Plane(this_00,(Vector3f *)local_84,d,this->_current_material);
    return this_00;
  }
  __assert_fail("_current_material != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x16f,"Plane *SceneParser::parsePlane()");
}

Assistant:

Plane *
SceneParser::parsePlane() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "normal"));
    Vector3f normal = readVector3f();
    getToken(token);
    assert(!strcmp(token, "offset"));
    float offset = readFloat();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Plane(normal, offset, _current_material);
}